

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

void __thiscall cmake::PrintPresetList(cmake *this,cmCMakePresetsGraph *graph)

{
  pointer this_00;
  function<bool_(const_cmCMakePresetsGraph::ConfigurePreset_&)> local_68;
  anon_class_8_1_afb109be local_48;
  anon_class_8_1_afb109be filter;
  undefined1 local_30 [8];
  vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_> generators;
  cmCMakePresetsGraph *graph_local;
  cmake *this_local;
  
  generators.super__Vector_base<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)graph;
  std::vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>::vector
            ((vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_> *)local_30);
  GetRegisteredGenerators
            (this,(vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_> *)local_30,
             false);
  this_00 = generators.
            super__Vector_base<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
  local_48.generators =
       (vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_> *)local_30;
  std::function<bool(cmCMakePresetsGraph::ConfigurePreset_const&)>::
  function<cmake::PrintPresetList(cmCMakePresetsGraph_const&)const::__0&,void>
            ((function<bool(cmCMakePresetsGraph::ConfigurePreset_const&)> *)&local_68,&local_48);
  cmCMakePresetsGraph::PrintConfigurePresetList
            ((cmCMakePresetsGraph *)this_00,&local_68,(PrintPrecedingNewline *)0x0);
  std::function<bool_(const_cmCMakePresetsGraph::ConfigurePreset_&)>::~function(&local_68);
  std::vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>::~vector
            ((vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_> *)local_30);
  return;
}

Assistant:

void cmake::PrintPresetList(const cmCMakePresetsGraph& graph) const
{
  std::vector<GeneratorInfo> generators;
  this->GetRegisteredGenerators(generators, false);
  auto filter =
    [&generators](const cmCMakePresetsGraph::ConfigurePreset& preset) -> bool {
    if (preset.Generator.empty()) {
      return true;
    }
    auto condition = [&preset](const GeneratorInfo& info) -> bool {
      return info.name == preset.Generator;
    };
    auto it = std::find_if(generators.begin(), generators.end(), condition);
    return it != generators.end();
  };

  graph.PrintConfigurePresetList(filter);
}